

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

TypeBase ** __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this,
          TypeModulePair *key)

{
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  TypeModulePair local_50;
  Node *local_38;
  Node *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  TypeModulePair *key_local;
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this_local;
  
  local_24 = this->bucketCount - 1;
  _bucket = key;
  key_local = (TypeModulePair *)this;
  uVar3 = TypeModulePairHasher::operator()((TypeModulePairHasher *)((long)&item + 7),key);
  i = uVar3 & local_24;
  item._0_4_ = 0;
  while( true ) {
    if (this->bucketCount <= (uint)item) {
      return (TypeBase **)0x0;
    }
    pNVar1 = this->data;
    uVar4 = (ulong)i;
    local_38 = pNVar1 + uVar4;
    TypeModulePair::TypeModulePair(&local_50);
    bVar2 = TypeModulePair::operator==(&pNVar1[uVar4].key,&local_50);
    if (bVar2) break;
    bVar2 = TypeModulePair::operator==(&local_38->key,_bucket);
    if (bVar2) {
      return &local_38->value;
    }
    i = i + (uint)item + 1 & local_24;
    item._0_4_ = (uint)item + 1;
  }
  return (TypeBase **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}